

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::write_int<__int128,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,__int128 value,basic_format_specs<char> *spec)

{
  byte bVar1;
  long in_RCX;
  long in_RDX;
  undefined1 local_38 [24];
  long local_20;
  char local_18;
  uint local_14;
  
  local_14 = 0;
  if (in_RDX < 0) {
    local_18 = '-';
    local_14 = 1;
    local_38._16_8_ = -(long)spec;
    local_20 = -(ulong)(spec != (basic_format_specs<char> *)0x0) - in_RDX;
  }
  else {
    bVar1 = *(byte *)(in_RCX + 9) >> 4 & 7;
    local_38._16_8_ = spec;
    local_20 = in_RDX;
    if (1 < bVar1) {
      local_18 = ' ';
      if (bVar1 == 2) {
        local_18 = '+';
      }
      local_14 = 1;
    }
  }
  local_38._0_8_ = this;
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>>
            (*(char *)(in_RCX + 8),
             (int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }